

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-lexer.cc
# Opt level: O2

void __thiscall
wabt::WastLexer::WastLexer
          (WastLexer *this,
          unique_ptr<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_> *source,
          string_view filename,Errors *errors)

{
  _Head_base<0UL,_wabt::LexerSource_*,_false> _Var1;
  char *pcVar2;
  allocator<char> local_21;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20._M_str = filename._M_str;
  local_20._M_len = filename._M_len;
  (this->source_)._M_t.
  super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>._M_t.
  super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
  super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl =
       (source->_M_t).
       super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>._M_t.
       super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
       super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl;
  (source->_M_t).super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>.
  _M_t.super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
  super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl = (LexerSource *)0x0;
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)&this->filename_,&local_20,&local_21);
  this->line_ = 1;
  _Var1._M_head_impl =
       (this->source_)._M_t.
       super___uniq_ptr_impl<wabt::LexerSource,_std::default_delete<wabt::LexerSource>_>._M_t.
       super__Tuple_impl<0UL,_wabt::LexerSource_*,_std::default_delete<wabt::LexerSource>_>.
       super__Head_base<0UL,_wabt::LexerSource_*,_false>._M_head_impl;
  pcVar2 = (char *)(_Var1._M_head_impl)->data_;
  this->buffer_ = pcVar2;
  this->buffer_end_ = pcVar2 + (_Var1._M_head_impl)->size_;
  this->line_start_ = pcVar2;
  this->token_start_ = pcVar2;
  this->cursor_ = pcVar2;
  this->errors_ = errors;
  return;
}

Assistant:

WastLexer::WastLexer(std::unique_ptr<LexerSource> source,
                     std::string_view filename,
                     Errors* errors)
    : source_(std::move(source)),
      filename_(filename),
      line_(1),
      buffer_(static_cast<const char*>(source_->data())),
      buffer_end_(buffer_ + source_->size()),
      line_start_(buffer_),
      token_start_(buffer_),
      cursor_(buffer_),
      errors_(errors) {}